

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmFScc<(moira::Instr)199,(moira::Mode)7,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  bool bVar1;
  StrWriter *pSVar2;
  Ea<(moira::Mode)7,_1> local_4c;
  int local_38;
  Fcc local_34;
  byte local_2e;
  byte local_2d;
  u32 local_2c;
  u8 cnd;
  u32 uStack_28;
  u8 reg;
  u32 ext;
  u32 old;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  uStack_28 = *addr;
  ext._2_2_ = op;
  _old = addr;
  addr_local = (u32 *)str;
  str_local = (StrWriter *)this;
  local_2c = dasmIncRead<2>(this,addr);
  local_2d = (byte)ext._2_2_ & 7;
  local_2e = (byte)local_2c & 0x3f;
  if (((**(int **)(addr_local + 0xc) != 2) && (**(int **)(addr_local + 0xc) != 3)) ||
     (bVar1 = isValidExtFPU(this,FScc,AW,ext._2_2_,local_2c), bVar1)) {
    pSVar2 = StrWriter::operator<<((StrWriter *)addr_local);
    Fcc::Fcc(&local_34,(uint)local_2e);
    pSVar2 = StrWriter::operator<<(pSVar2,local_34);
    local_38 = addr_local[0xe];
    pSVar2 = StrWriter::operator<<(pSVar2,(Tab)local_38);
    Op<(moira::Mode)7,1>(&local_4c,this,(ushort)local_2d,_old);
    StrWriter::operator<<(pSVar2,&local_4c);
  }
  else {
    *_old = uStack_28;
    dasmIllegal<(moira::Instr)199,(moira::Mode)7,1>(this,(StrWriter *)addr_local,_old,ext._2_2_);
  }
  return;
}

Assistant:

void
Moira::dasmFScc(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead(addr);
    auto reg = _____________xxx (op);
    auto cnd = __________xxxxxx (ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtFPU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << Fcc{cnd} << str.tab << Op<M, S>(reg, addr);
}